

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O1

int32_t delta_from_arg_vals(rtosc_arg_val_t *llhsarg,rtosc_arg_val_t *lhsarg,rtosc_arg_val_t *rhsarg
                           ,rtosc_arg_val_t *delta,int must_be_unity)

{
  int iVar1;
  int res;
  rtosc_cmp_options cmp_options;
  rtosc_arg_val_t div;
  rtosc_arg_val_t null_val;
  rtosc_arg_val_t width2;
  int local_7c;
  rtosc_cmp_options local_78;
  rtosc_arg_val_t local_70;
  rtosc_arg_val_t local_58;
  rtosc_arg_val_t local_40;
  
  if (must_be_unity == 0) {
    rtosc_arg_val_sub(lhsarg,llhsarg,delta);
    rtosc_arg_val_null(&local_58,delta->type);
    iVar1 = rtosc_arg_vals_cmp(delta,&local_58,1,1,(rtosc_cmp_options *)0x0);
  }
  else {
    iVar1 = rtosc_arg_vals_cmp(lhsarg,rhsarg,1,1,(rtosc_cmp_options *)0x0);
    rtosc_arg_val_from_int(delta,rhsarg->type,1);
    if (0 < iVar1) {
      rtosc_arg_val_negate(delta);
      iVar1 = 1;
    }
  }
  if (iVar1 == 0) {
LAB_0010e619:
    local_7c = -1;
  }
  else {
    if (rhsarg == (rtosc_arg_val_t *)0x0) {
      local_7c = -1;
    }
    else {
      rtosc_arg_val_sub(rhsarg,lhsarg,&local_58);
      rtosc_arg_val_div(&local_58,delta,&local_70);
      rtosc_arg_val_round(&local_70);
      rtosc_arg_val_mult(&local_70,delta,&local_40);
      local_78.float_tolerance = 0.001;
      iVar1 = rtosc_arg_vals_eq(&local_58,&local_40,1,1,&local_78);
      if (iVar1 == 0) goto LAB_0010e619;
      rtosc_arg_val_to_int(&local_70,&local_7c);
    }
    local_7c = local_7c + 1;
  }
  return local_7c;
}

Assistant:

int32_t delta_from_arg_vals(const rtosc_arg_val_t* llhsarg,
                            const rtosc_arg_val_t* lhsarg,
                            const rtosc_arg_val_t* rhsarg,
                            rtosc_arg_val_t* delta,
                            int must_be_unity)
{
    /*
        compute delta
    */
    int cmp;
    if(must_be_unity)
    {
        cmp = rtosc_arg_vals_cmp(lhsarg, rhsarg, 1, 1, NULL);
        rtosc_arg_val_from_int(delta, rhsarg->type, 1);
        if(cmp > 0)
            rtosc_arg_val_negate(delta);
    }
    else
    {
        rtosc_arg_val_sub(lhsarg, llhsarg, delta);
        rtosc_arg_val_t null_val;
        rtosc_arg_val_null(&null_val, delta->type);
        cmp = rtosc_arg_vals_cmp(delta, &null_val, 1, 1, NULL);
    }

    if(!cmp)
        return -1;

    /*
     * check if delta matches,
     * i.e. there's an "n" s. t. lhsarg + n*delta = rhsarg
     */
    int res;
    if(rhsarg)
    {
        rtosc_arg_val_t width, div, width2;
        rtosc_arg_val_sub(rhsarg, lhsarg, &width);
        rtosc_arg_val_div(&width, delta, &div);
        rtosc_arg_val_round(&div);
        rtosc_arg_val_mult(&div, delta, &width2);

        const rtosc_cmp_options cmp_options
         = ((rtosc_cmp_options) { 0.001 });
        if( ! rtosc_arg_vals_eq(&width, &width2, 1, 1, &cmp_options))
            return -1;

        rtosc_arg_val_to_int(&div, &res);
    }
    else
        res = -1; // return 0 to say "infinite range"
    return res + 1;
}